

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wthelper.h
# Opt level: O2

void __thiscall
WriterTestHelper<unsigned_char,_1U,_33321U>::resize
          (WriterTestHelper<unsigned_char,_1U,_33321U> *this,createFlags flags,ktx_uint32_t layers,
          ktx_uint32_t faces,ktx_uint32_t dimensions,ktx_uint32_t w,ktx_uint32_t h,ktx_uint32_t d,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *requestedColor)

{
  ktxHashList *ppkVar1;
  vector<std::vector<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>,_std::allocator<std::vector<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>_>_>
  *this_00;
  pointer pwVar2;
  byte bVar3;
  ktx_uint32_t i;
  GLuint levels;
  uint uVar4;
  ulong uVar5;
  size_t sVar6;
  ktx_uint32_t faceSlice;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  char *__assertion;
  uint uVar12;
  long lVar13;
  bool array;
  uint local_84;
  vector<unsigned_char,_std::allocator<unsigned_char>_> color;
  ktxHashListEntry *pWriter;
  
  if (d == 1 || faces == 1) {
    if ((requestedColor == (vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x0) ||
       ((requestedColor->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
        super__Vector_impl_data._M_finish !=
        (requestedColor->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
        super__Vector_impl_data._M_start)) {
      this->width = w;
      this->height = h;
      this->depth = d;
      if ((flags & 1) == 0) {
        levels = 1;
      }
      else {
        levels = levelsFromSize(w,h,d);
      }
      this->numLevels = levels;
      this->numLayers = layers;
      this->numFaces = faces;
      array = (bool)((byte)(flags >> 2) & 1);
      this->isArray = array;
      texinfo::resize(&this->texinfo,levels,layers,faces,dimensions,array,w,h,d);
      this->imageDataSize = 0;
      this_00 = &this->images;
      std::
      vector<std::vector<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>,_std::allocator<std::vector<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>_>_>
      ::resize(this_00,(ulong)this->numLevels);
      std::vector<wthImageInfo,_std::allocator<wthImageInfo>_>::resize
                (&this->imageList,
                 (ulong)(this->numLayers * this->numLevels * this->numFaces * this->depth));
      color.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      color.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      color.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&color,1);
      if (requestedColor != (vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x0) {
        *color.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start =
             *(requestedColor->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
              _M_impl.super__Vector_impl_data._M_start;
      }
      local_84 = 0;
      for (uVar11 = 0; uVar11 < this->numLevels; uVar11 = uVar11 + 1) {
        bVar3 = (byte)uVar11;
        uVar4 = this->depth >> (bVar3 & 0x1f);
        uVar12 = this->width;
        uVar7 = this->height;
        std::
        vector<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
        ::resize((this->images).
                 super__Vector_base<std::vector<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>,_std::allocator<std::vector<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + uVar11,(ulong)this->numLayers);
        uVar7 = uVar7 >> (bVar3 & 0x1f);
        uVar12 = uVar12 >> (bVar3 & 0x1f);
        uVar12 = (uVar12 + (uVar12 == 0)) * (uVar7 + (uVar7 == 0));
        for (uVar9 = 0; uVar9 < this->numLayers; uVar9 = uVar9 + 1) {
          uVar7 = this->numFaces;
          if (this->numFaces != 6) {
            uVar7 = uVar4 + (uVar4 == 0);
          }
          lVar13 = uVar9 * 0x18;
          std::
          vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
          ::resize((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                    *)(*(long *)&(this->images).
                                 super__Vector_base<std::vector<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>,_std::allocator<std::vector<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[uVar11].
                                 super__Vector_base<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
                                 ._M_impl.super__Vector_impl_data + lVar13),(ulong)uVar7);
          for (uVar8 = 0; uVar8 != uVar7; uVar8 = uVar8 + 1) {
            lVar10 = uVar8 * 0x18;
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                       (*(long *)(*(long *)&(this_00->
                                            super__Vector_base<std::vector<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>,_std::allocator<std::vector<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>_>_>
                                            )._M_impl.super__Vector_impl_data._M_start[uVar11].
                                            super__Vector_base<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
                                            ._M_impl.super__Vector_impl_data + lVar13) + lVar10),
                       (ulong)uVar12);
            if (requestedColor == (vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x0) {
              *color.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start = bVar3;
            }
            for (uVar5 = 0; uVar12 != uVar5; uVar5 = uVar5 + 1) {
              *(uchar *)(*(long *)(*(long *)(*(long *)&(this_00->
                                                                                                              
                                                  super__Vector_base<std::vector<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>,_std::allocator<std::vector<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start[uVar11]
                                                  .
                                                  super__Vector_base<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
                                                  ._M_impl.super__Vector_impl_data + lVar13) +
                                  lVar10) + uVar5) =
                   *color.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start;
            }
            uVar5 = (ulong)local_84;
            pwVar2 = (this->imageList).
                     super__Vector_base<wthImageInfo,_std::allocator<wthImageInfo>_>._M_impl.
                     super__Vector_impl_data._M_start;
            pwVar2[uVar5].size = uVar12;
            this->imageDataSize = this->imageDataSize + (long)(int)uVar12;
            local_84 = local_84 + 1;
            pwVar2[uVar5].data =
                 *(GLubyte **)
                  (*(long *)(*(long *)&(this->images).
                                       super__Vector_base<std::vector<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>,_std::allocator<std::vector<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start[uVar11].
                                       super__Vector_base<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
                                       ._M_impl.super__Vector_impl_data + lVar13) + lVar10);
          }
        }
      }
      if (dimensions == 1) {
        snprintf(this->orientation,0xf,"S=%c",0x72);
      }
      else if (dimensions == 2) {
        snprintf(this->orientation,0xf,"S=%c,T=%c",0x72,100);
      }
      else if (dimensions == 3) {
        snprintf(this->orientation,0xf,"S=%c,T=%c,R=%c",0x72,100,0x69);
      }
      builtin_strncpy(this->orientation_ktx2,"rdi",4);
      this->orientation_ktx2[dimensions] = '\0';
      ppkVar1 = &this->kvHash;
      ktxHashList_Construct(ppkVar1);
      sVar6 = strlen(this->orientation);
      ktxHashList_AddKVPair(ppkVar1,"KTXorientation",(int)sVar6 + 1,this->orientation);
      ktxHashList_Serialize(ppkVar1,&this->kvDataLen,&this->kvData);
      ppkVar1 = &this->kvHash_ktx2;
      ktxHashList_Construct(ppkVar1);
      ktxHashList_AddKVPair
                (ppkVar1,"KTXwriter",(int)(this->writer_ktx2)._M_string_length,
                 (this->writer_ktx2)._M_dataplus._M_p);
      ktxHashList_FindEntry(ppkVar1,"KTXwriter",&pWriter);
      appendLibId(ppkVar1,pWriter);
      ktxHashList_Serialize(ppkVar1,&this->kvDataLenWriter_ktx2,&this->kvDataWriter_ktx2);
      ktxHashList_AddKVPair(ppkVar1,"KTXorientation",dimensions + 1,this->orientation_ktx2);
      ktxHashList_Sort(ppkVar1);
      ktxHashList_Serialize(ppkVar1,&this->kvDataLenAll_ktx2,&this->kvDataAll_ktx2);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                (&color.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
      return;
    }
    __assertion = "requestedColor == nullptr || requestedColor->size() >= numComponents";
    uVar12 = 0x54;
  }
  else {
    __assertion = "faces == 1 || d == 1";
    uVar12 = 0x53;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tests/unittests/wthelper.h"
                ,uVar12,
                "void WriterTestHelper<unsigned char, 1, 33321>::resize(createFlags, ktx_uint32_t, ktx_uint32_t, ktx_uint32_t, ktx_uint32_t, ktx_uint32_t, ktx_uint32_t, std::vector<component_type> *) [component_type = unsigned char, numComponents = 1, internalformat = 33321]"
               );
}

Assistant:

void resize(createFlags flags,
                ktx_uint32_t layers, ktx_uint32_t faces,
                ktx_uint32_t dimensions,
                ktx_uint32_t w, ktx_uint32_t h, ktx_uint32_t d,
                std::vector<component_type>* requestedColor = nullptr)
    {
        assert(faces == 1 || d == 1);
        assert(requestedColor == nullptr || requestedColor->size() >= numComponents);

        this->width = w;
        this->height = h;
        this->depth = d;
        numLevels = flags & eMipmapped? levelsFromSize(w, h, d): 1;
        this->numLayers = layers;
        this->numFaces=faces;
        isArray = flags & eArray ? true : false;
        texinfo.resize(numLevels, layers, faces, dimensions,
                       isArray, w, h, d);

        // Create the image set.
        imageDataSize = 0;
        images.resize(numLevels);
        imageList.resize(numLevels * numLayers * numFaces * depth);
        std::vector<component_type> color;
        color.resize(numComponents);
        if (requestedColor != nullptr) {
            for (ktx_uint32_t i = 0; i < numComponents; i++) {
                color[i] = (*requestedColor)[i];
            }
        }
        for (ktx_uint32_t level = 0, count = 0; level < numLevels; level++) {
            ktx_uint32_t levelWidth = MAX(1, width >> level);
            ktx_uint32_t levelHeight = MAX(1, height >> level);
            ktx_uint32_t levelDepth = MAX(1, depth >> level);
            images[level].resize(numLayers);
            for (ktx_uint32_t layer = 0; layer < numLayers; layer++) {
                ktx_uint32_t numImages = numFaces == 6 ? numFaces : levelDepth;
                images[level][layer].resize(numImages);
                for (ktx_uint32_t faceSlice = 0; faceSlice < numImages; faceSlice++) {
                    ktx_uint32_t componentCount, pixelCount;
                    pixelCount = levelWidth * levelHeight;
                    componentCount = pixelCount * numComponents;
                    images[level][layer][faceSlice].resize(componentCount);
                    // Using std::vector avoids warnings in the following
                    // switch due to access past the end of the array, if we
                    // were using an array and numComponents < 4.
                    if (requestedColor == nullptr) {
                        switch (numComponents) {
                          case 4:
                            color[3] = (component_type)0.5;
                            FALLTHROUGH;
                          case 3:
                            color[2] = (component_type)faceSlice;
                            FALLTHROUGH;
                          case 2:
                            color[1] = (component_type)layer;
                            FALLTHROUGH;
                          case 1:
                            color[0] = (component_type)level;
                            break;
                        }
                    }
                    for (ktx_uint32_t i = 0; i < pixelCount; i++) {
                        for (ktx_uint32_t j = 0; j < numComponents; j++) {
                            ktx_uint32_t ci = i * numComponents + j;
                            images[level][layer][faceSlice][ci] = color[j];
                        }
                    }
                    imageList[count].size
                         = pixelCount * numComponents * sizeof(component_type);
                    imageDataSize += imageList[count].size;
                    imageList[count++].data
                         = (GLubyte*)images[level][layer][faceSlice].data();
                }
            }
        }

        switch (dimensions) {
          case 1:
            assert(strlen(KTX_ORIENTATION1_FMT) < sizeof(orientation));
            snprintf(orientation, sizeof(orientation), KTX_ORIENTATION1_FMT,
                     'r');
            break;
          case 2:
            assert(strlen(KTX_ORIENTATION2_FMT) < sizeof(orientation));
            snprintf(orientation, sizeof(orientation), KTX_ORIENTATION2_FMT,
                     'r', 'd');
            break;
          case 3:
            assert(strlen(KTX_ORIENTATION3_FMT) < sizeof(orientation));
            snprintf(orientation, sizeof(orientation), KTX_ORIENTATION3_FMT,
                     'r', 'd', 'i');
            break;
        }
        assert(4 <= sizeof(orientation_ktx2));
        orientation_ktx2[0] = 'r';
        orientation_ktx2[1] = 'd';
        orientation_ktx2[2] = 'i';
        orientation_ktx2[3] = 0;
        orientation_ktx2[dimensions] = 0; // Ensure terminating NULL.

        ktxHashList_Construct(&kvHash);
        ktxHashList_AddKVPair(&kvHash, KTX_ORIENTATION_KEY,
                              (unsigned int)strlen(orientation) + 1,
                              orientation);
        ktxHashList_Serialize(&kvHash, &kvDataLen, &kvData);


        ktxHashList_Construct(&kvHash_ktx2);
        ktxHashList_AddKVPair(&kvHash_ktx2, KTX_WRITER_KEY,
                              (ktx_uint32_t)writer_ktx2.size(),
                              writer_ktx2.data());

        // Get the library to add its Id to the writer key so it will be
        // included in the serialized data.
        ktxHashListEntry* pWriter;
        ktxHashList_FindEntry(&kvHash_ktx2, KTX_WRITER_KEY,
                              &pWriter);
        appendLibId(&kvHash_ktx2, pWriter);

        ktxHashList_Serialize(&kvHash_ktx2, &kvDataLenWriter_ktx2, &kvDataWriter_ktx2);
        ktxHashList_AddKVPair(&kvHash_ktx2, KTX_ORIENTATION_KEY,
                              dimensions + 1,
                              orientation_ktx2);
        ktxHashList_Sort(&kvHash_ktx2);
        ktxHashList_Serialize(&kvHash_ktx2, &kvDataLenAll_ktx2, &kvDataAll_ktx2);
    }